

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_ray_hit_info *
rf_collision_ray_triangle
          (rf_ray_hit_info *__return_storage_ptr__,rf_ray ray,rf_vec3 p1,rf_vec3 p2,rf_vec3 p3)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  fVar11 = p1.z;
  fVar15 = p1.x;
  fVar1 = p1.y;
  fVar2 = p2.x - fVar15;
  fVar3 = p2.y - fVar1;
  fVar4 = p2.z - fVar11;
  fVar5 = p3.x - fVar15;
  fVar6 = p3.y - fVar1;
  fVar7 = p3.z - fVar11;
  fVar12 = ray.direction.x;
  fVar14 = ray.direction.y;
  fVar9 = fVar14 * fVar7 - ray.direction.z * fVar6;
  fVar10 = ray.direction.z * fVar5 - fVar7 * fVar12;
  fVar13 = fVar12 * fVar6 - fVar5 * fVar14;
  fVar8 = fVar4 * fVar13 + fVar2 * fVar9 + fVar3 * fVar10;
  *(undefined8 *)&(__return_storage_ptr__->position).z = 0;
  (__return_storage_ptr__->normal).y = 0.0;
  (__return_storage_ptr__->normal).z = 0.0;
  __return_storage_ptr__->hit = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x1 = 0;
  __return_storage_ptr__->distance = 0.0;
  (__return_storage_ptr__->position).x = 0.0;
  (__return_storage_ptr__->position).y = 0.0;
  if (1e-06 <= ABS(fVar8)) {
    fVar8 = 1.0 / fVar8;
    fVar15 = ray.position.x - fVar15;
    fVar1 = ray.position.y - fVar1;
    fVar11 = ray.position.z - fVar11;
    fVar9 = (fVar13 * fVar11 + fVar9 * fVar15 + fVar10 * fVar1) * fVar8;
    if ((0.0 <= fVar9) && (fVar9 <= 1.0)) {
      fVar10 = fVar1 * fVar4 - fVar11 * fVar3;
      fVar11 = fVar11 * fVar2 - fVar4 * fVar15;
      fVar1 = fVar15 * fVar3 - fVar2 * fVar1;
      fVar15 = (ray.direction.z * fVar1 + fVar12 * fVar10 + fVar14 * fVar11) * fVar8;
      if ((0.0 <= fVar15) &&
         ((fVar9 + fVar15 <= 1.0 &&
          (fVar8 = fVar8 * (fVar1 * fVar7 + fVar10 * fVar5 + fVar11 * fVar6), 1e-06 < fVar8)))) {
        __return_storage_ptr__->hit = true;
        __return_storage_ptr__->distance = fVar8;
        fVar9 = fVar3 * fVar7 + -fVar6 * fVar4;
        fVar1 = fVar4 * fVar5 - fVar7 * fVar2;
        fVar11 = fVar6 * fVar2 + -fVar3 * fVar5;
        fVar15 = fVar11 * fVar11 + fVar9 * fVar9 + fVar1 * fVar1;
        if (fVar15 < 0.0) {
          fVar15 = sqrtf(fVar15);
        }
        else {
          fVar15 = SQRT(fVar15);
        }
        fVar15 = (float)(-(uint)(fVar15 == 0.0) & 0x3f800000 |
                        ~-(uint)(fVar15 == 0.0) & (uint)(1.0 / fVar15));
        (__return_storage_ptr__->normal).x = fVar9 * fVar15;
        (__return_storage_ptr__->normal).y = fVar1 * fVar15;
        (__return_storage_ptr__->normal).z = fVar11 * fVar15;
        (__return_storage_ptr__->position).x = ray.position.x + fVar12 * fVar8;
        (__return_storage_ptr__->position).y = ray.position.y + fVar14 * fVar8;
        (__return_storage_ptr__->position).z = ray.position.z + ray.direction.z * fVar8;
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_ray_hit_info rf_collision_ray_triangle(rf_ray ray, rf_vec3 p1, rf_vec3 p2, rf_vec3 p3)
{
#define rf_epsilon 0.000001 // Just a small number

    rf_vec3 edge1, edge2;
    rf_vec3 p, q, tv;
    float det, inv_det, u, v, t;
    rf_ray_hit_info result = {0};

// Find vectors for two edges sharing V1
    edge1 = rf_vec3_sub(p2, p1);
    edge2 = rf_vec3_sub(p3, p1);

// Begin calculating determinant - also used to calculate u parameter
    p = rf_vec3_cross_product(ray.direction, edge2);

// If determinant is near zero, ray lies in plane of triangle or ray is parallel to plane of triangle
    det = rf_vec3_dot_product(edge1, p);

// Avoid culling!
    if ((det > -rf_epsilon) && (det < rf_epsilon)) return result;

    inv_det = 1.0f / det;

// Calculate distance from V1 to ray origin
    tv = rf_vec3_sub(ray.position, p1);

// Calculate u parameter and test bound
    u = rf_vec3_dot_product(tv, p) * inv_det;

// The intersection lies outside of the triangle
    if ((u < 0.0f) || (u > 1.0f)) return result;

// Prepare to test v parameter
    q = rf_vec3_cross_product(tv, edge1);

// Calculate V parameter and test bound
    v = rf_vec3_dot_product(ray.direction, q) * inv_det;

// The intersection lies outside of the triangle
    if ((v < 0.0f) || ((u + v) > 1.0f)) return result;

    t = rf_vec3_dot_product(edge2, q) * inv_det;

    if (t > rf_epsilon)
    {
// rf_ray hit, get hit point and normal
        result.hit = true;
        result.distance = t;
        result.hit = true;
        result.normal = rf_vec3_normalize(rf_vec3_cross_product(edge1, edge2));
        result.position = rf_vec3_add(ray.position, rf_vec3_scale(ray.direction, t));
    }

    return result;
}